

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O0

void __thiscall tt::detail::ThreadData::runInThread(ThreadData *this)

{
  int iVar1;
  ulong uVar2;
  long *in_FS_OFFSET;
  char *local_20;
  ThreadData *this_local;
  
  iVar1 = CurrentThread::tid();
  *this->m_tid = iVar1;
  this->m_tid = (pid_t *)0x0;
  CountDownLatch::countDown(this->m_latch);
  this->m_latch = (CountDownLatch *)0x0;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_20 = (char *)std::__cxx11::string::c_str();
  }
  else {
    local_20 = "tt_Thread";
  }
  *(char **)(*in_FS_OFFSET + -0x38) = local_20;
  prctl(0xf,*(undefined8 *)(*in_FS_OFFSET + -0x38));
  std::function<void_()>::operator()(&this->m_func);
  *(char **)(*in_FS_OFFSET + -0x38) = "finish";
  return;
}

Assistant:

void runInThread(){
			*m_tid = tt::CurrentThread::tid();
			m_tid = NULL;
			m_latch->countDown();
			m_latch = NULL;
			
			tt::CurrentThread::t_threadName = m_name.empty() ? "tt_Thread" : m_name.c_str();

			::prctl(PR_SET_NAME,tt::CurrentThread::t_threadName);

	/*		try{
				m_func();
				tt::CurrentThread::t_threadName = "finish";
			}catch (const Exception& ex){
*/
			m_func();
			tt::CurrentThread::t_threadName = "finish";
		}